

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.c
# Opt level: O2

void proxy_shutdown(proxy_handle *ph)

{
  void *pvVar1;
  
  pvVar1 = ph->priv;
  proxy_log(ph,LOG_LEVEL_DEBUG,"Proxy shutdown requested.\n");
  mutex_lock((mutex_handle *)((long)pvVar1 + 0x870));
  *(undefined4 *)((long)pvVar1 + 0x83c) = 0;
  mutex_unlock((mutex_handle *)((long)pvVar1 + 0x870));
  proxy_update_registration(ph);
  conn_shutdown((conn_handle *)((long)pvVar1 + 0x840));
  return;
}

Assistant:

void proxy_shutdown(struct proxy_handle *ph)
{
	struct proxy_priv *priv = ph->priv;

	proxy_log(ph, LOG_LEVEL_DEBUG, "Proxy shutdown requested.\n");

	mutex_lock(&priv->usable_clients_mutex);
	priv->usable_clients = 0;
	mutex_unlock(&priv->usable_clients_mutex);

	proxy_update_registration(ph);

	conn_shutdown(&priv->conn_listen);
}